

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
          (RepeatedPtrFieldBase *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar1;
  
  pVVar1 = UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                     (this);
  if (this->arena_ != (Arena *)0x0) {
    pVVar1 = copy<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                       (pVVar1);
    return pVVar1;
  }
  return pVVar1;
}

Assistant:

[[nodiscard]] Value<TypeHandler>* ReleaseLast() {
    Value<TypeHandler>* result = UnsafeArenaReleaseLast<TypeHandler>();
    // Now perform a copy if we're on an arena.
    Arena* arena = GetArena();

    if (internal::DebugHardenForceCopyInRelease()) {
      auto* new_result = copy<TypeHandler>(result);
      if (arena == nullptr) delete result;
      return new_result;
    } else {
      return (arena == nullptr) ? result : copy<TypeHandler>(result);
    }
  }